

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

void amqp_messenger_do_work(AMQP_MESSENGER_HANDLE messenger_handle)

{
  LOGGER_LOG p_Var1;
  AMQP_MESSENGER_INSTANCE_conflict *msgr;
  LOGGER_LOG l;
  AMQP_MESSENGER_HANDLE messenger_handle_local;
  
  if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"amqp_messenger_do_work",0x566,1,"Invalid argument (messenger_handle is NULL)");
    }
  }
  else {
    process_state_changes(messenger_handle);
    manage_amqp_messengers(messenger_handle);
    if (messenger_handle->state == AMQP_MESSENGER_STATE_STARTED) {
      message_queue_do_work(messenger_handle->send_queue);
    }
    handle_errors_and_timeouts(messenger_handle);
  }
  return;
}

Assistant:

void amqp_messenger_do_work(AMQP_MESSENGER_HANDLE messenger_handle)
{
    if (messenger_handle == NULL)
    {
        LogError("Invalid argument (messenger_handle is NULL)");
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* msgr = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        process_state_changes(msgr);

        manage_amqp_messengers(msgr);

        if (msgr->state == AMQP_MESSENGER_STATE_STARTED)
        {
            message_queue_do_work(msgr->send_queue);
        }

        handle_errors_and_timeouts(msgr);
    }
}